

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroupCollection::SetDistinct
          (RowGroupCollection *this,column_t column_id,
          unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
          *distinct_stats)

{
  ColumnStatistics *this_00;
  TableStatistics *in_RDX;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  stats_lock;
  TableStatisticsLock *in_stack_ffffffffffffff98;
  unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
  *distinct;
  TableStatistics *in_stack_ffffffffffffffa0;
  unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
  local_38 [7];
  
  TableStatistics::GetLock(in_RDX);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
             *)in_stack_ffffffffffffffa0);
  this_00 = TableStatistics::GetStats(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0xbb5c0a);
  distinct = local_38;
  unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>::
  unique_ptr((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)this_00,distinct);
  ColumnStatistics::SetDistinct(this_00,distinct);
  unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
               *)0xbb5c3e);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  ~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
               *)0xbb5c48);
  return;
}

Assistant:

void RowGroupCollection::SetDistinct(column_t column_id, unique_ptr<DistinctStatistics> distinct_stats) {
	D_ASSERT(column_id != COLUMN_IDENTIFIER_ROW_ID);
	auto stats_lock = stats.GetLock();
	stats.GetStats(*stats_lock, column_id).SetDistinct(std::move(distinct_stats));
}